

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void jmp_patchins(FuncState *fs,BCPos pc,BCPos dest)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  BCPos offset;
  BCIns *jmp;
  ErrMsg in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = (in_EDX - (in_ESI + 1)) + 0x8000;
  if (0xffff < uVar1) {
    err_syntax((LexState *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  *(short *)(*(long *)(in_RDI + 0x48) + (ulong)in_ESI * 8 + 2) = (short)uVar1;
  return;
}

Assistant:

static void jmp_patchins(FuncState *fs, BCPos pc, BCPos dest)
{
  BCIns *jmp = &fs->bcbase[pc].ins;
  BCPos offset = dest-(pc+1)+BCBIAS_J;
  lj_assertFS(dest != NO_JMP, "uninitialized jump target");
  if (offset > BCMAX_D)
    err_syntax(fs->ls, LJ_ERR_XJUMP);
  setbc_d(jmp, offset);
}